

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O3

int Tab_TabHashAdd(Tab_Tab_t *p,int *pLits,int Func,int Cost)

{
  bool bVar1;
  Tab_Obj_t *pTVar2;
  long lVar3;
  Tab_Obj_t *pTVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  
  uVar7 = p->SizeMask;
  iVar11 = p->nBins;
  if (iVar11 == uVar7 + 1) {
    if (p->pBins == (Tab_Obj_t *)0x0) {
      pTVar2 = (Tab_Obj_t *)malloc((long)iVar11 << 5);
    }
    else {
      pTVar2 = (Tab_Obj_t *)realloc(p->pBins,(long)iVar11 << 5);
      uVar7 = p->SizeMask;
      iVar11 = uVar7 + 1;
    }
    p->pBins = pTVar2;
    lVar3 = (long)(int)uVar7;
    memset(pTVar2 + (long)(int)uVar7 + 1,0,(long)iVar11 << 4);
    if (pTVar2 < pTVar2 + (long)(int)uVar7 + 1) {
      pTVar4 = pTVar2 + -1;
      do {
        pTVar4[1].Table = 0;
        pTVar4[1].Next = 0;
        pTVar4 = pTVar4 + 1;
      } while (pTVar4 < pTVar2 + lVar3);
    }
    uVar7 = uVar7 * 2 + 1;
    p->SizeMask = uVar7;
    uVar5 = 0x10;
    while ((Tab_Obj_t *)((long)&pTVar2[-1].Table + uVar5) < pTVar2 + lVar3) {
      uVar6 = (uint)(*(ulong *)(&pTVar2->field_0x8 + uVar5) >> 0x20);
      uVar6 = (uVar6 >> 0x1e) * 0x18000005 +
              ((uint)(*(ulong *)(&pTVar2->field_0x8 + uVar5) >> 0x11) & 0x7fff) * 0x3000005 +
              (uVar6 & 0x7fff) * 0x6000017 + (uVar6 >> 0xf & 0x7fff) * 0xc000013 & uVar7;
      iVar11 = pTVar2[uVar6].Table;
      *(int *)((long)&pTVar2->Next + uVar5) = iVar11;
      iVar8 = (int)(uVar5 >> 4);
      pTVar2[uVar6].Table = iVar8;
      uVar5 = uVar5 + 0x10;
      if (iVar11 == iVar8 && iVar11 != 0) {
        __assert_fail("!pEnt->Next || pEnt->Next != pBin->Table",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFx.c"
                      ,0x7f,"void Tab_TabRehash(Tab_Tab_t *)");
      }
    }
    iVar11 = p->nBins;
  }
  if ((int)uVar7 < iVar11) {
    __assert_fail("p->nBins < p->SizeMask + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFx.c"
                  ,0x87,"int Tab_TabHashAdd(Tab_Tab_t *, int *, int, int)");
  }
  pTVar2 = p->pBins;
  uVar6 = *pLits;
  uVar7 = Func * 0x18000005 + uVar6 * 0x3000005 + pLits[2] * 0xc000013 + pLits[1] * 0x6000017 &
          uVar7;
  iVar8 = pTVar2[(int)uVar7].Table;
  iVar9 = iVar8;
  if (pTVar2 != (Tab_Obj_t *)0x0 && iVar8 != 0) {
    do {
      uVar5 = *(ulong *)&pTVar2[iVar9].field_0x8;
      if (((((uint)(uVar5 >> 0x11) & 0x7fff) == uVar6) &&
          (uVar10 = (uint)(uVar5 >> 0x20), (uVar10 & 0x7fff) == pLits[1])) &&
         (uVar10 >> 0x1e == Func && (uVar10 >> 0xf & 0x7fff) == pLits[2])) {
        *(ulong *)&pTVar2[iVar9].field_0x8 =
             uVar5 & 0xfffffffffffe0000 | (ulong)(Cost + (int)uVar5 & 0x1ffff);
        goto LAB_0059c020;
      }
      lVar3 = (long)iVar9;
      iVar9 = pTVar2[lVar3].Next;
    } while (pTVar2[lVar3].Next != 0);
  }
  uVar6 = uVar6 << 0x11;
  uVar5 = *(ulong *)&pTVar2[iVar11].field_0x8;
  *(ulong *)&pTVar2[iVar11].field_0x8 = uVar5 & 0xffffffff0001ffff | (ulong)uVar6;
  uVar10 = pLits[1];
  *(ulong *)&pTVar2[iVar11].field_0x8 =
       uVar5 & 0xffff80000001ffff | (ulong)uVar6 | (ulong)(uVar10 & 0x7fff) << 0x20;
  *(ulong *)&pTVar2[iVar11].field_0x8 =
       (ulong)(Cost & 0x1ffff) |
       (ulong)(uint)Func << 0x3e |
       CONCAT44(uVar10,uVar6) & 0x7fffffffffff | (ulong)(pLits[2] & 0x7fff) << 0x2f;
  pTVar2[iVar11].Next = iVar8;
  iVar11 = p->nBins;
  p->nBins = iVar11 + 1;
  pTVar2[(int)uVar7].Table = iVar11;
  bVar1 = iVar8 == iVar11 && iVar8 != 0;
  pTVar2 = (Tab_Obj_t *)(ulong)CONCAT31((int3)((uint)iVar11 >> 8),bVar1);
  if (bVar1) {
    __assert_fail("!pEnt->Next || pEnt->Next != pBin->Table",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFx.c"
                  ,0x95,"int Tab_TabHashAdd(Tab_Tab_t *, int *, int, int)");
  }
LAB_0059c020:
  return (int)pTVar2;
}

Assistant:

static inline int         Tab_TabHashAdd( Tab_Tab_t * p, int * pLits, int Func, int Cost )
{
    if ( p->nBins == p->SizeMask + 1 )
        Tab_TabRehash( p );
    assert( p->nBins < p->SizeMask + 1 );
    {
        Tab_Obj_t * pEnt, * pBin = p->pBins + Tab_Hash(pLits[0], pLits[1], pLits[2], Func, p->SizeMask);
        for ( pEnt = Tab_TabEntry(p, pBin->Table); pEnt; pEnt = Tab_TabEntry(p, pEnt->Next) )
            if ( (int)pEnt->LitA == pLits[0] && (int)pEnt->LitB == pLits[1] && (int)pEnt->LitC == pLits[2] && (int)pEnt->Func == Func )
                {  pEnt->Cost += Cost; return 1; }
        pEnt = p->pBins + p->nBins;
        pEnt->LitA  = pLits[0];
        pEnt->LitB  = pLits[1];
        pEnt->LitC  = pLits[2];
        pEnt->Func  = Func;
        pEnt->Cost  = Cost;
        pEnt->Next  = pBin->Table;
        pBin->Table = p->nBins++;
        assert( !pEnt->Next || pEnt->Next != pBin->Table );
        return 0;
    }
}